

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O2

int Abc_NtkMaxFlowFwdPath2_rec(Abc_Obj_t *pObj)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar3 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    if ((pObj->field_6).pTemp == (void *)0x0) {
      if ((pObj->field_0x14 & 0x10) == 0) {
        lVar6 = 0;
        do {
          if ((pObj->vFanouts).nSize <= lVar6) {
            return 0;
          }
          pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
          iVar3 = Abc_NtkMaxFlowFwdPath2_rec(pAVar2);
          lVar6 = lVar6 + 1;
        } while (iVar3 == 0);
        (pObj->field_6).pCopy = pAVar2;
      }
      else {
        pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
      }
    }
    else {
      uVar1 = (pObj->vFanins).nSize;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          return 0;
        }
        pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[uVar5]];
        uVar5 = uVar5 + 1;
      } while ((Abc_Obj_t *)(pAVar2->field_6).pTemp != pObj);
      lVar6 = 0;
      do {
        if ((pAVar2->vFanouts).nSize <= lVar6) {
          iVar3 = Abc_NtkMaxFlowFwdPath2_rec(pAVar2);
          if (iVar3 == 0) goto LAB_003d44a2;
          (pAVar2->field_6).pTemp = (void *)0x0;
          goto LAB_003d4588;
        }
        pObj_00 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar6]];
        iVar3 = Abc_NtkMaxFlowFwdPath2_rec(pObj_00);
        lVar6 = lVar6 + 1;
      } while (iVar3 == 0);
      (pAVar2->field_6).pCopy = pObj_00;
    }
LAB_003d4588:
    iVar3 = 1;
  }
  else {
LAB_003d44a2:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Abc_NtkMaxFlowFwdPath2_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout, * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    // process node without flow
    if ( !Abc_ObjGetPath(pObj) )
    { 
        // start the path if we reached a terminal node
        if ( pObj->fMarkA )
            return Abc_ObjSetPath( pObj, (Abc_Obj_t *)1 );
        // explore the fanins
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_NtkMaxFlowFwdPath2_rec(pFanout) )
                return Abc_ObjSetPath( pObj, pFanout );
        return 0;
    }
    // pObj has flow - find the fanout with flow
    pFanin = Abc_ObjGetFaninPath( pObj );
    if ( pFanin == NULL )
        return 0;
    // go through the fanins of the fanout with flow
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( Abc_NtkMaxFlowFwdPath2_rec( pFanout ) )
            return Abc_ObjSetPath( pFanin, pFanout );
    // try the fanout
    if ( Abc_NtkMaxFlowFwdPath2_rec( pFanin ) )
        return Abc_ObjSetPath( pFanin, NULL );
    return 0;
}